

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(QPDFOutlineDocumentHelper *this,QPDF *qpdf)

{
  bool bVar1;
  Members *this_00;
  element_type *this_01;
  bool local_212;
  bool local_1f2;
  allocator<char> local_1a9;
  string local_1a8 [32];
  QPDFObjectHandle local_188;
  QPDFObjectHandle local_178;
  QPDFOutlineObjectHelper local_168;
  QPDFObjGen local_130;
  undefined1 local_128 [8];
  set seen;
  string local_f0 [32];
  undefined1 local_d0 [8];
  QPDFObjectHandle cur;
  string local_b8;
  allocator<char> local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  QPDFObjectHandle outlines;
  string local_58;
  undefined1 local_38 [8];
  QPDFObjectHandle root;
  QPDF *qpdf_local;
  QPDFOutlineDocumentHelper *this_local;
  
  QPDFDocumentHelper::QPDFDocumentHelper(&this->super_QPDFDocumentHelper,qpdf);
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFOutlineDocumentHelper_0058da50;
  this_00 = (Members *)operator_new(0x98);
  (this_00->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this_00->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->by_page)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->by_page)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->names_dest).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(this_00->by_page)._M_t._M_impl = 0;
  (this_00->dest_dict).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->names_dest).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->dest_dict).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this_00->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this_00->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  *(undefined8 *)
   &(this_00->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->outlines).
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   &(this_00->seen).super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
    _M_impl = 0;
  (this_00->outlines).
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->outlines).
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->by_page)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Members::Members(this_00);
  std::shared_ptr<QPDFOutlineDocumentHelper::Members>::
  shared_ptr<QPDFOutlineDocumentHelper::Members,void>(&this->m,this_00);
  QPDF::getRoot((QPDF *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"/Outlines",
             (allocator<char> *)
             ((long)&outlines.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&outlines.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_90,"/Outlines",&local_91);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_70,(string *)local_38);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    cur.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._6_1_ = 0;
    cur.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._5_1_ = 0;
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_70);
    local_1f2 = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      cur.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"/First",
                 (allocator<char> *)
                 ((long)&cur.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      cur.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._5_1_ = 1;
      local_1f2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_70,&local_b8);
    }
    if ((cur.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((cur.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&cur.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
    }
    if (((local_1f2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f0,"/First",
                 (allocator<char> *)
                 ((long)&seen.
                         super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                         _M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d0,(string *)local_70);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&seen.
                         super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                         _M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      QPDFObjGen::set::set((set *)local_128);
      while( true ) {
        bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_d0);
        local_212 = false;
        if (!bVar1) {
          local_130 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_d0);
          local_212 = QPDFObjGen::set::add((set *)local_128,local_130);
        }
        if (local_212 == false) break;
        this_01 = std::
                  __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m);
        QPDFObjectHandle::QPDFObjectHandle(&local_178,(QPDFObjectHandle *)local_d0);
        QPDFOutlineObjectHelper::Accessor::create(&local_168,&local_178,this,1);
        std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::push_back
                  (&this_01->outlines,&local_168);
        QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(&local_168);
        QPDFObjectHandle::~QPDFObjectHandle(&local_178);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1a8,"/Next",&local_1a9);
        QPDFObjectHandle::getKey(&local_188,(string *)local_d0);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_d0,&local_188);
        QPDFObjectHandle::~QPDFObjectHandle(&local_188);
        std::__cxx11::string::~string(local_1a8);
        std::allocator<char>::~allocator(&local_1a9);
      }
      QPDFObjGen::set::~set((set *)local_128);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
      outlines.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 0;
    }
    else {
      outlines.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 1;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_70);
  }
  else {
    outlines.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  return;
}

Assistant:

QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    QPDFObjectHandle root = qpdf.getRoot();
    if (!root.hasKey("/Outlines")) {
        return;
    }
    QPDFObjectHandle outlines = root.getKey("/Outlines");
    if (!(outlines.isDictionary() && outlines.hasKey("/First"))) {
        return;
    }
    QPDFObjectHandle cur = outlines.getKey("/First");
    QPDFObjGen::set seen;
    while (!cur.isNull() && seen.add(cur)) {
        m->outlines.push_back(QPDFOutlineObjectHelper::Accessor::create(cur, *this, 1));
        cur = cur.getKey("/Next");
    }
}